

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O2

int __thiscall cmXMLParser::ParseFile(cmXMLParser *this,char *file)

{
  int iVar1;
  undefined8 local_3b8 [4];
  ostringstream str;
  ifstream ifs;
  streambuf local_210 [16];
  byte abStack_200 [488];
  
  if (file == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    std::ifstream::ifstream(&ifs,file,_S_in);
    iVar1 = 0;
    if ((abStack_200[*(long *)(_ifs + -0x18)] & 5) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
      std::ostream::operator<<(&str,local_210);
      std::__cxx11::stringbuf::str();
      iVar1 = (*this->_vptr_cmXMLParser[2])(this,local_3b8[0]);
      std::__cxx11::string::~string((string *)local_3b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
    }
    std::ifstream::~ifstream(&ifs);
  }
  return iVar1;
}

Assistant:

int cmXMLParser::ParseFile(const char* file)
{
  if (!file) {
    return 0;
  }

  cmsys::ifstream ifs(file);
  if (!ifs) {
    return 0;
  }

  std::ostringstream str;
  str << ifs.rdbuf();
  return this->Parse(str.str().c_str());
}